

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

ExecutionResult * __thiscall
ASTNode::evaluate(ExecutionResult *__return_storage_ptr__,ASTNode *this,Context *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *name;
  bool bVar1;
  long lVar2;
  eval_error *peVar3;
  __shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  element_type *this_00;
  shared_ptr<SchemeObject> *local_360;
  ExecutionResult local_2c8;
  ExecutionResult local_2a8;
  _Self local_288;
  _List_const_iterator<std::shared_ptr<ASTNode>_> lit;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> val_list;
  shared_ptr<SchemeProcedure> f;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_250;
  undefined1 local_238 [8];
  shared_ptr<SchemeSpecialForm> sf;
  undefined1 local_208 [8];
  shared_ptr<SchemeObject> func;
  undefined1 local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  byte local_1a1;
  undefined1 local_1a0 [7];
  bool res;
  shared_ptr<SchemeObject> t;
  shared_ptr<SchemeChar> local_168;
  shared_ptr<SchemeObject> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  shared_ptr<SchemeFloat> local_128;
  shared_ptr<SchemeObject> local_118 [4];
  out_of_range *anon_var_0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> den;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> num;
  size_type slash_pos;
  double float_val;
  out_of_range *anon_var_0;
  shared_ptr<SchemeInt> local_40;
  shared_ptr<SchemeObject> local_30;
  Context *local_20;
  Context *context_local;
  ASTNode *this_local;
  
  local_20 = context;
  context_local = (Context *)this;
  this_local = (ASTNode *)__return_storage_ptr__;
  if (this->type == INT) {
    std::__cxx11::stoll(&this->value,(size_t *)0x0,10);
    std::make_shared<SchemeInt,long_long>((longlong *)&local_40);
    std::shared_ptr<SchemeObject>::shared_ptr<SchemeInt,void>(&local_30,&local_40);
    ExecutionResult::ExecutionResult(__return_storage_ptr__,&local_30);
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_30);
    std::shared_ptr<SchemeInt>::~shared_ptr(&local_40);
  }
  else if (this->type == FLOAT) {
    lVar2 = std::__cxx11::string::find((char)this + '\b',0x2f);
    if (lVar2 == -1) {
      std::__cxx11::stod(&this->value,(size_t *)0x0);
    }
    else {
      std::__cxx11::string::substr((ulong)((long)&den.field_2 + 8),(ulong)&this->value);
      std::__cxx11::string::substr((ulong)&anon_var_0_1,(ulong)&this->value);
      std::__cxx11::stoll((string *)((long)&den.field_2 + 8),(size_t *)0x0,10);
      std::__cxx11::stoll((string *)&anon_var_0_1,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&anon_var_0_1);
      std::__cxx11::string::~string((string *)(den.field_2._M_local_buf + 8));
    }
    std::make_shared<SchemeFloat,double&>((double *)&local_128);
    std::shared_ptr<SchemeObject>::shared_ptr<SchemeFloat,void>(local_118,&local_128);
    ExecutionResult::ExecutionResult(__return_storage_ptr__,local_118);
    std::shared_ptr<SchemeObject>::~shared_ptr(local_118);
    std::shared_ptr<SchemeFloat>::~shared_ptr(&local_128);
  }
  else if (this->type == STRING) {
    std::make_shared<SchemeString,std::__cxx11::string_const&>(&local_148);
    std::shared_ptr<SchemeObject>::shared_ptr<SchemeString,void>
              ((shared_ptr<SchemeObject> *)&local_148.field_2,(shared_ptr<SchemeString> *)&local_148
              );
    ExecutionResult::ExecutionResult
              (__return_storage_ptr__,(shared_ptr<SchemeObject> *)&local_148.field_2);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&local_148.field_2);
    std::shared_ptr<SchemeString>::~shared_ptr((shared_ptr<SchemeString> *)&local_148);
  }
  else if (this->type == CHAR) {
    name = &t.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::string((string *)name,(string *)&this->value);
    char_name_to_char((string *)name);
    std::make_shared<SchemeChar,unsigned_char>((uchar *)&local_168);
    std::shared_ptr<SchemeObject>::shared_ptr<SchemeChar,void>(&local_158,&local_168);
    ExecutionResult::ExecutionResult(__return_storage_ptr__,&local_158);
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_158);
    std::shared_ptr<SchemeChar>::~shared_ptr(&local_168);
    std::__cxx11::string::~string
              ((string *)&t.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  else if (this->type == BOOL) {
    bVar1 = std::operator==(&this->value,"t");
    if (bVar1) {
      local_360 = &scheme_true;
    }
    else {
      local_360 = &scheme_false;
    }
    ExecutionResult::ExecutionResult(__return_storage_ptr__,local_360);
  }
  else if (this->type == NAME) {
    std::shared_ptr<SchemeObject>::shared_ptr((shared_ptr<SchemeObject> *)local_1a0,(nullptr_t)0x0);
    local_1a1 = Context::get(local_20,&this->value,(shared_ptr<SchemeObject> *)local_1a0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
    if (!bVar1) {
      if ((local_1a1 & 1) != 0) {
        local_1c9 = 1;
        peVar3 = (eval_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1c8,"Unassigned variable: ",&this->value);
        eval_error::runtime_error(peVar3,&local_1c8);
        local_1c9 = 0;
        __cxa_throw(peVar3,&eval_error::typeinfo,eval_error::~eval_error);
      }
      func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
      peVar3 = (eval_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe10,"Undefined name: ",&this->value);
      eval_error::runtime_error(peVar3,(string *)&stack0xfffffffffffffe10);
      func.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
      __cxa_throw(peVar3,&eval_error::typeinfo,eval_error::~eval_error);
    }
    ExecutionResult::ExecutionResult(__return_storage_ptr__,(shared_ptr<SchemeObject> *)local_1a0);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_1a0);
  }
  else {
    if (this->type == VECTOR) {
      peVar3 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(peVar3,"Trying to evaluate a vector");
      __cxa_throw(peVar3,&eval_error::typeinfo,eval_error::~eval_error);
    }
    bVar1 = std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
            ::empty(&this->list);
    if (bVar1) {
      peVar3 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(peVar3,"Trying to evaluate empty list");
      __cxa_throw(peVar3,&eval_error::typeinfo,eval_error::~eval_error);
    }
    p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::__cxx11::
             list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::front
                       (&this->list);
    peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var4);
    evaluate((ExecutionResult *)
             &sf.super___shared_ptr<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             peVar5,local_20);
    ExecutionResult::force_value((ExecutionResult *)local_208);
    ExecutionResult::~ExecutionResult
              ((ExecutionResult *)
               &sf.super___shared_ptr<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::dynamic_pointer_cast<SchemeSpecialForm,SchemeObject>((shared_ptr<SchemeObject> *)local_238)
    ;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_238);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SchemeSpecialForm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_238);
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
                (&local_250,&this->list);
      SchemeSpecialForm::execute(__return_storage_ptr__,this_00,&local_250,local_20);
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
      ~list(&local_250);
    }
    else {
      std::dynamic_pointer_cast<SchemeProcedure,SchemeObject>
                ((shared_ptr<SchemeObject> *)
                 &val_list.
                  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  ._M_impl._M_node._M_size);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &val_list.
                          super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                          ._M_impl._M_node._M_size);
      if (!bVar1) {
        peVar3 = (eval_error *)__cxa_allocate_exception(0x10);
        eval_error::runtime_error(peVar3,"Trying to call not a function");
        __cxa_throw(peVar3,&eval_error::typeinfo,eval_error::~eval_error);
      }
      std::__cxx11::
      list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::list
                ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&lit);
      local_2a8.tail_context._M_t.
      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
           (__uniq_ptr_data<TailContext,_std::default_delete<TailContext>,_true,_true>)
           std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
           ::begin(&this->list);
      local_288._M_node =
           (_List_node_base *)
           std::next<std::_List_const_iterator<std::shared_ptr<ASTNode>>>
                     ((_List_const_iterator<std::shared_ptr<ASTNode>_>)
                      local_2a8.tail_context._M_t.
                      super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
                      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
                      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl,1);
      while( true ) {
        local_2a8.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::__cxx11::
                list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::end
                          (&this->list);
        bVar1 = std::operator!=(&local_288,
                                (_Self *)&local_2a8.value.
                                          super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
        if (!bVar1) break;
        p_Var4 = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_const_iterator<std::shared_ptr<ASTNode>_>::operator*(&local_288);
        peVar5 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        evaluate(&local_2c8,peVar5,local_20);
        ExecutionResult::force_value(&local_2a8);
        std::__cxx11::
        list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
        push_back((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                   *)&lit,(value_type *)&local_2a8);
        std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&local_2a8);
        ExecutionResult::~ExecutionResult(&local_2c8);
        std::_List_const_iterator<std::shared_ptr<ASTNode>_>::operator++(&local_288);
      }
      ExecutionResult::ExecutionResult
                (__return_storage_ptr__,
                 (shared_ptr<SchemeProcedure> *)
                 &val_list.
                  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  ._M_impl._M_node._M_size,
                 (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&lit);
      std::__cxx11::
      list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::~list
                ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&lit);
      std::shared_ptr<SchemeProcedure>::~shared_ptr
                ((shared_ptr<SchemeProcedure> *)
                 &val_list.
                  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  ._M_impl._M_node._M_size);
    }
    std::shared_ptr<SchemeSpecialForm>::~shared_ptr((shared_ptr<SchemeSpecialForm> *)local_238);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_208);
  }
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult ASTNode::evaluate(const Context &context) const
{

    if(type == ast_type_t::INT)
        try
        {
            return ExecutionResult(std::make_shared<SchemeInt>(stoll(value)));
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid integer: " + value);
        }
    if(type == ast_type_t::FLOAT)
    {
        double float_val;
        try
        {
            auto slash_pos = value.find('/');
            if (slash_pos != std::string::npos)
            {
                auto num = value.substr(0, slash_pos);
                auto den = value.substr(slash_pos + 1);
                float_val = double(stoll(num)) / double(stoll(den));
            }
            else
            {
                float_val = stod(value);
            }
        }
        catch(std::out_of_range &)
        {
            throw eval_error("Invalid float: " + value);
        }
        return ExecutionResult(std::make_shared<SchemeFloat>(float_val));
    }
    if(type == ast_type_t::STRING)
        return ExecutionResult(std::make_shared<SchemeString>(value));
    if(type == ast_type_t::CHAR)
        return ExecutionResult(std::make_shared<SchemeChar>(char_name_to_char(value)));
    if(type == ast_type_t::BOOL)
        return ExecutionResult(value == "t" ? scheme_true : scheme_false);
    if(type == ast_type_t::NAME)
    {
        std::shared_ptr<SchemeObject> t{nullptr};
        bool res = context.get(value, t);
        if(t)
            return ExecutionResult(t);
        else if(res)
            throw eval_error("Unassigned variable: " + value);
        else
            throw eval_error("Undefined name: " + value);
    }
    if(type == ast_type_t::VECTOR)
        throw eval_error("Trying to evaluate a vector");
    if(list.empty())
        throw eval_error("Trying to evaluate empty list");

    auto func = list.front()->evaluate(context).force_value();
    auto sf = std::dynamic_pointer_cast<SchemeSpecialForm>(func);
    if(sf)
    {
        return sf->execute(list, context);
    }
    auto f = std::dynamic_pointer_cast<SchemeProcedure>(func);
    if(!f)
    {
        throw eval_error("Trying to call not a function");
    }
    std::list<std::shared_ptr<SchemeObject>> val_list;
    for(auto lit = std::next(list.begin()); lit != list.end(); ++lit)
    {
        val_list.push_back((*lit)->evaluate(context).force_value());
    }
    return ExecutionResult(f, val_list);
}